

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Xcb.cpp
# Opt level: O0

void __thiscall tcu::x11::XcbWindow::setDimensions(XcbWindow *this,int width,int height)

{
  xcb_property_notify_event_t *pnEvent;
  int h;
  int w;
  xcb_generic_event_t *event;
  xcb_connection_t *local_30;
  xcb_connection_t *display;
  int local_20;
  xcb_void_cookie_t result;
  uint32_t values [2];
  int height_local;
  int width_local;
  XcbWindow *this_local;
  
  local_20 = width;
  result.sequence = height;
  local_30 = XcbDisplay::getConnection(this->m_display);
  event._4_4_ = xcb_configure_window(local_30,this->m_window,0xc,&local_20);
  display._4_4_ = event._4_4_;
  xcb_flush(local_30);
  do {
    _h = (byte *)xcb_poll_for_event(local_30);
    if (_h != (byte *)0x0) {
      if (((*_h & 0x7f) == 0x1c) && (*(int *)(_h + 8) == 0x3c)) {
        deFree(_h);
        return;
      }
      deFree(_h);
    }
    (*(this->super_WindowBase)._vptr_WindowBase[5])(this,(long)&pnEvent + 4,&pnEvent);
    if ((int)pnEvent == height) {
      return;
    }
  } while (pnEvent._4_4_ != width);
  return;
}

Assistant:

void XcbWindow::setDimensions (int width, int height)
{
	const uint32_t		values[]	= {static_cast<uint32_t >(width), static_cast<uint32_t >(height)};
	xcb_void_cookie_t	result;
	xcb_connection_t*	display		= m_display.getConnection();
	result = xcb_configure_window(display, m_window, XCB_CONFIG_WINDOW_WIDTH | XCB_CONFIG_WINDOW_HEIGHT, values);
	DE_ASSERT(DE_NULL == xcb_request_check(display,result));
	xcb_flush (display);

	for(;;)
	{
		xcb_generic_event_t*	event = xcb_poll_for_event(display);
		int						w, h;
		if(event != DE_NULL)
		{
			if (XCB_PROPERTY_NOTIFY == (event->response_type & ~0x80))
			{
				const xcb_property_notify_event_t* pnEvent = (xcb_property_notify_event_t*)event;
				if (pnEvent->atom == XCB_ATOM_RESOLUTION)
				{
					deFree(event);
					break;
				}
			}
			deFree(event);
		}
		getDimensions (&w,&h);
		if (h==height || w==width)
			break;
	}
}